

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

double ON_MatrixSolutionPrecision
                 (uint N,double **M,bool bTransposeM,double lambda,double *X,double *B)

{
  double d_1;
  double Mei_1;
  double *e_1;
  double *Mi;
  uint i_1;
  double *e0;
  double d;
  double dStack_58;
  uint j;
  double Mei;
  double *e;
  double dStack_40;
  uint i;
  double delta;
  double *B_local;
  double *X_local;
  double lambda_local;
  bool bTransposeM_local;
  double **M_local;
  uint N_local;
  
  dStack_40 = 0.0;
  if (bTransposeM) {
    for (e._4_4_ = 0; e._4_4_ < N; e._4_4_ = e._4_4_ + 1) {
      dStack_58 = -(lambda * X[e._4_4_]);
      Mei = (double)X;
      for (d._4_4_ = 0; d._4_4_ < N; d._4_4_ = d._4_4_ + 1) {
        dStack_58 = M[d._4_4_][e._4_4_] * *(double *)Mei + dStack_58;
        Mei = (double)((long)Mei + 8);
      }
      if (dStack_40 < ABS(dStack_58 - B[e._4_4_])) {
        dStack_40 = ABS(dStack_58 - B[e._4_4_]);
      }
    }
  }
  else {
    for (Mi._4_4_ = 0; Mi._4_4_ < N; Mi._4_4_ = Mi._4_4_ + 1) {
      d_1 = -(lambda * X[Mi._4_4_]);
      e_1 = M[Mi._4_4_];
      for (Mei_1 = (double)X; (ulong)Mei_1 < X + N; Mei_1 = (double)((long)Mei_1 + 8)) {
        d_1 = *e_1 * *(double *)Mei_1 + d_1;
        e_1 = e_1 + 1;
      }
      if (dStack_40 < ABS(d_1 - B[Mi._4_4_])) {
        dStack_40 = ABS(d_1 - B[Mi._4_4_]);
      }
    }
  }
  return dStack_40;
}

Assistant:

double ON_MatrixSolutionPrecision(
  const unsigned int N,
  const double*const* M,
  bool bTransposeM,
  double lambda,
  const double* X,
  const double* B
  )
{
  double delta = 0.0;
  if (bTransposeM)
  {
    for (unsigned int i = 0; i < N; i++)
    {
      const double* e = X;
      double Mei = -(lambda*e[i]);
      for ( unsigned int j = 0; j < N; j++ )
        Mei += M[j][i]*(*e++);
      double d = fabs(Mei - B[i]);
      if (d > delta)
        delta = d;
    }
  }
  else
  {
    const double* e0 = X + N;
    for (unsigned int i = 0; i < N; i++)
    {
      const double* Mi = M[i];
      const double* e = X;
      double Mei = -(lambda*e[i]);
      while (e < e0)
        Mei += (*Mi++)*(*e++);
      double d = fabs(Mei - B[i]);
      if (d > delta)
        delta = d;
    }
  }

  return delta;
}